

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.h
# Opt level: O0

unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> __thiscall
testinator::MakeOutputter(testinator *this,string *name,OutputFlags flags)

{
  bool bVar1;
  unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  local_40;
  unique_ptr<testinator::TAPOutputter,_std::default_delete<testinator::TAPOutputter>_> local_38 [3];
  undefined1 local_1d;
  OutputFlags local_1c;
  string *psStack_18;
  OutputFlags flags_local;
  string *name_local;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> *op;
  
  local_1d = 0;
  local_1c = flags;
  psStack_18 = name;
  name_local = (string *)this;
  ::std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<std::default_delete<testinator::Outputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)this);
  bVar1 = ::std::operator==(psStack_18,"TAP");
  if (bVar1) {
    ::std::make_unique<testinator::TAPOutputter>();
    ::std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::operator=
              ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)this,
               local_38);
    ::std::unique_ptr<testinator::TAPOutputter,_std::default_delete<testinator::TAPOutputter>_>::
    ~unique_ptr(local_38);
  }
  else {
    ::std::make_unique<testinator::DefaultOutputter,std::ostream&,testinator::OutputFlags&>
              ((basic_ostream<char,_std::char_traits<char>_> *)&local_40,(OutputFlags *)&::std::cout
              );
    ::std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::operator=
              ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)this,
               &local_40);
    ::std::
    unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>::
    ~unique_ptr(&local_40);
  }
  return (__uniq_ptr_data<testinator::Outputter,_std::default_delete<testinator::Outputter>,_true,_true>
          )(__uniq_ptr_data<testinator::Outputter,_std::default_delete<testinator::Outputter>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<Outputter> MakeOutputter(
      const std::string& name,
      OutputFlags flags)
  {
    std::unique_ptr<Outputter> op;
    if (name == "TAP")
      op = std::make_unique<TAPOutputter>();
    else
      op = std::make_unique<DefaultOutputter>(std::cout, flags);
    return op;
  }